

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::
BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test::
~BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test
          (BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test
           *this)

{
  BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test *this_local;
  
  ~BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BlockingQueueTest, test_poll_will_block_until_second_thread_pushes_to_empty_queue)
{
    std::chrono::high_resolution_clock::time_point start_time = std::chrono::high_resolution_clock::now();
    BlockingQueue<int> queue = BlockingQueue<int>();

    std::thread thread(PushToIntBlockingQueueAfterSleep, &queue, 1, std::chrono::milliseconds(500));
    EXPECT_TRUE(*queue.Poll(std::chrono::milliseconds(1000)) == 1);

    std::chrono::high_resolution_clock::time_point time_now = std::chrono::high_resolution_clock::now();
    std::chrono::high_resolution_clock::duration elapsed = time_now - start_time;
    EXPECT_LT(elapsed, std::chrono::milliseconds(600));

    thread.join();
}